

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall UnitTests::Assert::False(Assert *this,bool expr)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  False(this,&local_38,expr);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void False(bool expr) const
        {
            False("", expr);
        }